

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gtk.cxx
# Opt level: O0

void gtk_thin_down_frame(int x,int y,int w,int h,Fl_Color c)

{
  Fl_Color FVar1;
  Fl_Color c_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  FVar1 = fl_color_average(0x38,c,0.4);
  gtk_color(FVar1);
  fl_xyline(x + 1,y,x + w + -2);
  fl_yxline(x,y + 1,y + h + -2);
  FVar1 = fl_color_average(0xff,c,0.6);
  gtk_color(FVar1);
  fl_xyline(x + 1,y + h + -1,x + w + -2);
  fl_yxline(x + w + -1,y + 1,y + h + -2);
  return;
}

Assistant:

static void gtk_thin_down_frame(int x, int y, int w, int h, Fl_Color c) {
  gtk_color(fl_color_average(FL_BLACK, c, 0.4f));
  fl_xyline(x + 1, y, x + w - 2);
  fl_yxline(x, y + 1, y + h - 2);

  gtk_color(fl_color_average(FL_WHITE, c, 0.6f));
  fl_xyline(x + 1, y + h - 1, x + w - 2);
  fl_yxline(x + w - 1, y + 1, y + h - 2);
}